

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::str<kj::_::DebugComparison<capnp::ElementSize,capnp::ElementSize>&>
          (String *__return_storage_ptr__,kj *this,
          DebugComparison<capnp::ElementSize,_capnp::ElementSize> *params)

{
  DebugComparison<capnp::ElementSize,_capnp::ElementSize> *this_00;
  DebugComparison<capnp::ElementSize,_capnp::ElementSize> *value;
  String local_30;
  kj *local_18;
  DebugComparison<capnp::ElementSize,_capnp::ElementSize> *params_local;
  
  local_18 = this;
  params_local = (DebugComparison<capnp::ElementSize,_capnp::ElementSize> *)__return_storage_ptr__;
  this_00 = fwd<kj::_::DebugComparison<capnp::ElementSize,capnp::ElementSize>&>
                      ((DebugComparison<capnp::ElementSize,_capnp::ElementSize> *)this);
  toCharSequence<kj::_::DebugComparison<capnp::ElementSize,capnp::ElementSize>&>
            (&local_30,(kj *)this_00,value);
  _::concat(__return_storage_ptr__,&local_30);
  String::~String(&local_30);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}